

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDsd.c
# Opt level: O0

void Abc_NtkDsdConstruct(Dsd_Manager_t *pManDsd,Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkNew)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Dsd_Node_t *p;
  int local_50;
  int local_4c;
  int nNodesDsd;
  int i;
  Abc_Obj_t *pDriver;
  Abc_Obj_t *pNodeNew;
  Abc_Obj_t *pNode;
  Dsd_Node_t *pNodeDsd;
  Dsd_Node_t **ppNodesDsd;
  Abc_Ntk_t *pNtkNew_local;
  Abc_Ntk_t *pNtk_local;
  Dsd_Manager_t *pManDsd_local;
  
  ppNodesDsd = (Dsd_Node_t **)pNtkNew;
  pNtkNew_local = pNtk;
  pNtk_local = (Abc_Ntk_t *)pManDsd;
  pAVar3 = Abc_NtkCreateNodeConst1(pNtkNew);
  pDriver = pAVar3;
  pAVar4 = Abc_AigConst1(pNtkNew_local);
  (pAVar4->field_6).pCopy = pAVar3;
  p = Dsd_ManagerReadConst1((Dsd_Manager_t *)pNtk_local);
  Dsd_NodeSetMark(p,(int)pDriver);
  for (local_4c = 0; iVar2 = local_4c, iVar1 = Abc_NtkCiNum(pNtkNew_local), iVar2 < iVar1;
      local_4c = local_4c + 1) {
    pNodeNew = Abc_NtkCi(pNtkNew_local,local_4c);
    pNode = (Abc_Obj_t *)Dsd_ManagerReadInput((Dsd_Manager_t *)pNtk_local,local_4c);
    Dsd_NodeSetMark((Dsd_Node_t *)pNode,(pNodeNew->field_6).iTemp);
  }
  pNodeDsd = (Dsd_Node_t *)Dsd_TreeCollectNodesDfs((Dsd_Manager_t *)pNtk_local,&local_50);
  for (local_4c = 0; local_4c < local_50; local_4c = local_4c + 1) {
    Abc_NtkDsdConstructNode
              ((Dsd_Manager_t *)pNtk_local,*(Dsd_Node_t **)(&pNodeDsd->Type + (long)local_4c * 2),
               (Abc_Ntk_t *)ppNodesDsd,(int *)0x0);
  }
  if (pNodeDsd != (Dsd_Node_t *)0x0) {
    free(pNodeDsd);
    pNodeDsd = (Dsd_Node_t *)0x0;
  }
  local_4c = 0;
  do {
    iVar2 = local_4c;
    iVar1 = Abc_NtkCoNum(pNtkNew_local);
    if (iVar1 <= iVar2) {
      return;
    }
    pNodeNew = Abc_NtkCo(pNtkNew_local,local_4c);
    _nNodesDsd = Abc_ObjFanin0(pNodeNew);
    iVar2 = Abc_ObjIsNode(_nNodesDsd);
    if ((iVar2 != 0) && (iVar2 = Abc_AigNodeIsAnd(_nNodesDsd), iVar2 != 0)) {
      pNode = (Abc_Obj_t *)Dsd_ManagerReadRoot((Dsd_Manager_t *)pNtk_local,local_4c);
      iVar2 = Dsd_NodeReadMark((Dsd_Node_t *)((ulong)pNode & 0xfffffffffffffffe));
      pDriver = (Abc_Obj_t *)(long)iVar2;
      iVar2 = Abc_ObjIsComplement(pDriver);
      if (iVar2 != 0) {
        __assert_fail("!Abc_ObjIsComplement(pNodeNew)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcDsd.c"
                      ,0xc9,"void Abc_NtkDsdConstruct(Dsd_Manager_t *, Abc_Ntk_t *, Abc_Ntk_t *)");
      }
      pAVar3 = Abc_ObjNotCond(pDriver,(uint)pNode & 1);
      (_nNodesDsd->field_6).pCopy = pAVar3;
    }
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

void Abc_NtkDsdConstruct( Dsd_Manager_t * pManDsd, Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkNew )
{
    Dsd_Node_t ** ppNodesDsd;
    Dsd_Node_t * pNodeDsd;
    Abc_Obj_t * pNode, * pNodeNew, * pDriver;
    int i, nNodesDsd;

    // save the CI nodes in the DSD nodes
    Abc_AigConst1(pNtk)->pCopy = pNodeNew = Abc_NtkCreateNodeConst1(pNtkNew);
    Dsd_NodeSetMark( Dsd_ManagerReadConst1(pManDsd), (int)(ABC_PTRINT_T)pNodeNew );
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        pNodeDsd = Dsd_ManagerReadInput( pManDsd, i );
        Dsd_NodeSetMark( pNodeDsd, (int)(ABC_PTRINT_T)pNode->pCopy );
    }

    // collect DSD nodes in DFS order (leaves and const1 are not collected)
    ppNodesDsd = Dsd_TreeCollectNodesDfs( pManDsd, &nNodesDsd );
    for ( i = 0; i < nNodesDsd; i++ )
        Abc_NtkDsdConstructNode( pManDsd, ppNodesDsd[i], pNtkNew, NULL );
    ABC_FREE( ppNodesDsd );

    // set the pointers to the CO drivers
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pDriver = Abc_ObjFanin0( pNode );
        if ( !Abc_ObjIsNode(pDriver) )
            continue;
        if ( !Abc_AigNodeIsAnd(pDriver) )
            continue;
        pNodeDsd = Dsd_ManagerReadRoot( pManDsd, i );
        pNodeNew = (Abc_Obj_t *)(ABC_PTRINT_T)Dsd_NodeReadMark( Dsd_Regular(pNodeDsd) );
        assert( !Abc_ObjIsComplement(pNodeNew) );
        pDriver->pCopy = Abc_ObjNotCond( pNodeNew, Dsd_IsComplement(pNodeDsd) );
    }
}